

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O3

Offset wabt::WriteU32Leb128Raw(uint8_t *dest,uint8_t *dest_end,uint32_t value)

{
  bool bVar1;
  uint32_t uVar2;
  long lVar3;
  Offset __n;
  uint8_t data [5];
  byte local_d [5];
  
  lVar3 = 0;
  uVar2 = value;
  if (0x7f < value) {
    do {
      uVar2 = value >> 7;
      local_d[lVar3] = (byte)value | 0x80;
      lVar3 = lVar3 + 1;
      bVar1 = 0x3fff < value;
      value = uVar2;
    } while (bVar1);
  }
  local_d[lVar3] = (byte)uVar2;
  __n = lVar3 + 1;
  if ((ulong)((long)dest_end - (long)dest) < __n) {
    __n = 0;
  }
  else {
    memcpy(dest,local_d,__n);
  }
  return __n;
}

Assistant:

Offset WriteU32Leb128Raw(uint8_t* dest, uint8_t* dest_end, uint32_t value) {
  uint8_t data[MAX_U32_LEB128_BYTES];
  Offset length = 0;
  LEB128_LOOP_UNTIL(value == 0);
  if (static_cast<Offset>(dest_end - dest) < length) {
    return 0;
  }
  memcpy(dest, data, length);
  return length;
}